

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O3

int ngp_set_extver(char *extname,int version)

{
  int iVar1;
  NGP_EXTVER_TAB *pNVar2;
  size_t sVar3;
  char *__dest;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  pNVar2 = ngp_extver_tab;
  if (extname == (char *)0x0) {
    return 0x170;
  }
  if (ngp_extver_tab == (NGP_EXTVER_TAB *)0x0 && 0 < ngp_extver_tab_size) {
    return 0x170;
  }
  lVar5 = (long)ngp_extver_tab_size;
  if (ngp_extver_tab != (NGP_EXTVER_TAB *)0x0 && ngp_extver_tab_size < 1) {
    return 0x170;
  }
  uVar6 = (ulong)(uint)ngp_extver_tab_size;
  if (ngp_extver_tab_size < 1) {
    if (ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) {
      pNVar2 = (NGP_EXTVER_TAB *)malloc(0x10);
      goto LAB_001750a0;
    }
  }
  else {
    lVar4 = 0;
    do {
      iVar1 = strcmp(extname,*(char **)((long)&pNVar2->extname + lVar4));
      if (iVar1 == 0) {
        if (version <= *(int *)((long)&pNVar2->version + lVar4)) {
          return 0;
        }
        *(int *)((long)&pNVar2->version + lVar4) = version;
        return 0;
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar6 << 4 != lVar4);
  }
  pNVar2 = (NGP_EXTVER_TAB *)realloc(pNVar2,lVar5 * 0x10 + 0x10);
LAB_001750a0:
  iVar1 = 0x168;
  if (pNVar2 != (NGP_EXTVER_TAB *)0x0) {
    sVar3 = strlen(extname);
    __dest = (char *)malloc(sVar3 + 1);
    if (__dest == (char *)0x0) {
      free(pNVar2);
    }
    else {
      strcpy(__dest,extname);
      lVar5 = (long)ngp_extver_tab_size;
      ngp_extver_tab_size = ngp_extver_tab_size + 1;
      ngp_extver_tab = pNVar2;
      pNVar2[lVar5].extname = __dest;
      pNVar2[lVar5].version = version;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int	ngp_set_extver(char *extname, int version)
 { NGP_EXTVER_TAB *p;
   char 	*p2;
   int		i;

   if (NULL == extname) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (0 == strcmp(extname, ngp_extver_tab[i].extname))
        { if (version > ngp_extver_tab[i].version)  ngp_extver_tab[i].version = version;
          return(NGP_OK);
        }
    }

   if (NULL == ngp_extver_tab)
     { p = (NGP_EXTVER_TAB *)ngp_alloc(sizeof(NGP_EXTVER_TAB)); }
   else
     { p = (NGP_EXTVER_TAB *)ngp_realloc(ngp_extver_tab, (ngp_extver_tab_size + 1) * sizeof(NGP_EXTVER_TAB)); }

   if (NULL == p) return(NGP_NO_MEMORY);

   p2 = ngp_alloc(strlen(extname) + 1);
   if (NULL == p2)
     { ngp_free(p);
       return(NGP_NO_MEMORY);
     }

   strcpy(p2, extname);
   ngp_extver_tab = p;
   ngp_extver_tab[ngp_extver_tab_size].extname = p2;
   ngp_extver_tab[ngp_extver_tab_size].version = version;

   ngp_extver_tab_size++;

   return(NGP_OK);
 }